

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O3

QModelIndexList * __thiscall
QAbstractItemView::selectedIndexes(QModelIndexList *__return_storage_ptr__,QAbstractItemView *this)

{
  quintptr qVar1;
  int iVar2;
  char cVar3;
  iterator aend;
  iterator iVar4;
  long lVar5;
  long lVar6;
  QModelIndex *pQVar8;
  long lVar9;
  const_iterator abegin;
  QModelIndex *pQVar10;
  long in_FS_OFFSET;
  QArrayDataPointer<QModelIndex> local_50;
  long local_38;
  QModelIndex *pQVar7;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar6 = *(long *)(this + 8);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QModelIndex *)0x0;
  (__return_storage_ptr__->d).size = 0;
  lVar5 = *(long *)(lVar6 + 800);
  if (((lVar5 == 0) || (*(int *)(lVar5 + 4) == 0)) || (*(long *)(lVar6 + 0x328) == 0))
  goto LAB_005368b9;
  QItemSelectionModel::selectedIndexes();
  QArrayDataPointer<QModelIndex>::operator=(&__return_storage_ptr__->d,&local_50);
  if (&(local_50.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d)->super_QArrayData,0x18,0x10);
    }
  }
  pQVar8 = (__return_storage_ptr__->d).ptr;
  lVar6 = (__return_storage_ptr__->d).size;
  lVar5 = lVar6;
  pQVar10 = pQVar8;
  if (0 < lVar6 >> 2) {
    lVar9 = (lVar6 >> 2) + 1;
    lVar5 = lVar6 * 0x18;
    do {
      cVar3 = (**(code **)(*(long *)this + 0x2c0))(this,pQVar10);
      pQVar7 = pQVar10;
      if (cVar3 != '\0') goto LAB_00536844;
      cVar3 = (**(code **)(*(long *)this + 0x2c0))(this,pQVar10 + 1);
      pQVar7 = pQVar10 + 1;
      if (cVar3 != '\0') goto LAB_00536844;
      cVar3 = (**(code **)(*(long *)this + 0x2c0))(this,pQVar10 + 2);
      pQVar7 = pQVar10 + 2;
      if (cVar3 != '\0') goto LAB_00536844;
      cVar3 = (**(code **)(*(long *)this + 0x2c0))(this,pQVar10 + 3);
      pQVar7 = pQVar10 + 3;
      if (cVar3 != '\0') goto LAB_00536844;
      pQVar10 = pQVar10 + 4;
      lVar9 = lVar9 + -1;
      lVar5 = lVar5 + -0x60;
    } while (1 < lVar9);
    lVar5 = (lVar5 >> 3) * -0x5555555555555555;
  }
  if (lVar5 == 1) {
LAB_00536829:
    cVar3 = (**(code **)(*(long *)this + 0x2c0))(this,pQVar10);
    pQVar7 = pQVar8 + lVar6;
    if (cVar3 != '\0') {
      pQVar7 = pQVar10;
    }
  }
  else {
    pQVar7 = pQVar10;
    if (lVar5 == 2) {
LAB_00536805:
      cVar3 = (**(code **)(*(long *)this + 0x2c0))(this,pQVar7);
      if (cVar3 == '\0') {
        pQVar10 = pQVar7 + 1;
        goto LAB_00536829;
      }
    }
    else {
      pQVar7 = pQVar8 + lVar6;
      if ((lVar5 == 3) &&
         (cVar3 = (**(code **)(*(long *)this + 0x2c0))(this,pQVar10), pQVar7 = pQVar10,
         cVar3 == '\0')) {
        pQVar7 = pQVar10 + 1;
        goto LAB_00536805;
      }
    }
  }
LAB_00536844:
  lVar6 = (long)pQVar7 - (long)pQVar8;
  if ((lVar6 >> 3) * -0x5555555555555555 - (__return_storage_ptr__->d).size != 0) {
    aend = QList<QModelIndex>::end(__return_storage_ptr__);
    iVar4 = QList<QModelIndex>::begin(__return_storage_ptr__);
    abegin.i = iVar4.i + lVar6;
    pQVar8 = lVar6 + iVar4.i;
    while (pQVar10 = pQVar8, pQVar8 = pQVar10 + 1, pQVar8 != aend.i) {
      cVar3 = (**(code **)(*(long *)this + 0x2c0))(this,pQVar8);
      if (cVar3 == '\0') {
        ((abegin.i)->m).ptr = pQVar10[1].m.ptr;
        iVar2 = pQVar8->c;
        qVar1 = pQVar10[1].i;
        (abegin.i)->r = pQVar8->r;
        (abegin.i)->c = iVar2;
        (abegin.i)->i = qVar1;
        abegin.i = abegin.i + 1;
      }
    }
    QList<QModelIndex>::erase(__return_storage_ptr__,abegin,(const_iterator)aend.i);
  }
LAB_005368b9:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QModelIndexList QAbstractItemView::selectedIndexes() const
{
    Q_D(const QAbstractItemView);
    QModelIndexList indexes;
    if (d->selectionModel) {
        indexes = d->selectionModel->selectedIndexes();
        auto isHidden = [this](const QModelIndex &idx) {
            return isIndexHidden(idx);
        };
        indexes.removeIf(isHidden);
    }
    return indexes;
}